

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

Node * __thiscall czh::parser::Parser::parse(Node *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  source_location local_128;
  allocator<char> local_119;
  string local_118;
  Token local_f8;
  source_location local_a8 [3];
  allocator<char> local_89;
  string local_88;
  Token local_68;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  if (this->curr_node == (Node *)0x0) {
    node::Node::reset(&this->node);
    this->curr_node = &this->node;
    lexer::Lexer::reset(this->lex);
  }
  get(&local_68,this);
  czh::token::Token::operator=(&this->curr_tok,&local_68);
  czh::token::Token::~Token(&local_68);
  TVar1 = (this->curr_tok).type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Unexpected end of czh.",&local_89);
  local_a8[0]._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_002770e0;
  czh::error::czh_assert(TVar1 != FEND,&local_88,local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  while (bVar2 = check(this), bVar2) {
    switch((this->curr_tok).type) {
    case ID:
      parse_id(this);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"Unexpected token",&local_119);
      local_128._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_002770f8;
      czh::error::czh_unreachable(&local_118,&local_128);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      break;
    case FEND:
      this->curr_node = (Node *)0x0;
      node::Node::Node(__return_storage_ptr__,&this->node);
      return __return_storage_ptr__;
    case SEND:
      get(&local_f8,this);
      czh::token::Token::operator=(&this->curr_tok,&local_f8);
      czh::token::Token::~Token(&local_f8);
      break;
    case SCEND:
      parse_end(this);
    }
  }
  this->curr_node = (Node *)0x0;
  node::Node::Node(__return_storage_ptr__,&this->node);
  return __return_storage_ptr__;
}

Assistant:

node::Node parse()
    {
      if (curr_node == nullptr)
      {
        node.reset();
        curr_node = &node;
        lex->reset();
      }
      curr_tok = get();
      error::czh_assert(curr_tok.type != token::TokenType::FEND, "Unexpected end of czh.");
      while (check())
      {
        switch (curr_tok.type)
        {
          case token::TokenType::ID:
            parse_id();
            break;
          case token::TokenType::SCEND:
            parse_end();
            break;
          case token::TokenType::SEND:
            curr_tok = get();
            break;
          case token::TokenType::FEND:
            curr_node = nullptr;
            return std::move(node);
          default:
            error::czh_unreachable("Unexpected token");
            break;
        }
      }
      curr_node = nullptr;
      return std::move(node);
    }